

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tchostsi.cpp
# Opt level: O0

void __thiscall CTcHostIfcStdio::v_print_step(CTcHostIfcStdio *this,char *msg,__va_list_tag *args)

{
  long in_RDI;
  __va_list_tag *in_stack_000007f0;
  char *in_stack_000007f8;
  CTcHostIfcStdio *in_stack_00000800;
  char *local_28;
  
  if (*(int *)(in_RDI + 8) != 0) {
    if (*(long *)(in_RDI + 0x10) == 0) {
      local_28 = "\t";
    }
    else {
      local_28 = *(char **)(in_RDI + 0x10);
    }
    printf("%s",local_28);
    v_printf(in_stack_00000800,in_stack_000007f8,in_stack_000007f0);
  }
  return;
}

Assistant:

void CTcHostIfcStdio::v_print_step(const char *msg, va_list args)
{
    /* if we're showing progress messages, proceed */
    if (show_progress_)
    {
        /* show the status message prefix (use a tab by default) */
        printf("%s", status_prefix_ != 0 ? status_prefix_ : "\t");

        /* display the message on the standard output */
        v_printf(msg, args);
    }
}